

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_interface.cpp
# Opt level: O0

string * __thiscall
cppcms::session_interface::session_cookie_name_abi_cxx11_(session_interface *this)

{
  cached_settings *pcVar1;
  string *in_RDI;
  session_interface *in_stack_ffffffffffffffd8;
  
  pcVar1 = cached_settings(in_stack_ffffffffffffffd8);
  std::__cxx11::string::string((string *)in_RDI,(string *)&(pcVar1->session).cookies);
  return in_RDI;
}

Assistant:

std::string session_interface::session_cookie_name()
{
	return cached_settings().session.cookies.prefix;
}